

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O0

void __thiscall OpenMD::DynamicRectMatrix<double>::deallocate(DynamicRectMatrix<double> *this)

{
  void *pvVar1;
  long *in_RDI;
  uint i;
  uint local_c;
  
  for (local_c = 0; local_c < *(uint *)(in_RDI + 1); local_c = local_c + 1) {
    pvVar1 = *(void **)(*in_RDI + (ulong)local_c * 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,8);
    }
  }
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete__((void *)*in_RDI);
  }
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *in_RDI = 0;
  return;
}

Assistant:

void deallocate() {
      for (unsigned int i = 0; i < nrow_; ++i)
        delete data_[i];
      delete[] data_;

      nrow_ = 0;
      ncol_ = 0;
      data_ = NULL;
    }